

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

Stream * rw::xbox::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 5)) {
    Stream::writeU32(stream,5);
    lVar2 = *(long *)((long)object + 0x98);
    lVar3 = *(long *)(lVar2 + 0x38);
    *(undefined4 *)(lVar3 + 0x18) = *(undefined4 *)(lVar2 + 4);
    *(undefined2 *)(lVar3 + 0x1c) = *(undefined2 *)(lVar2 + 8);
    uVar1 = *(ushort *)(lVar2 + 10);
    *(ushort *)(lVar3 + 0x1e) = uVar1;
    *(undefined4 *)(lVar3 + 0x20) = *(undefined4 *)(lVar2 + 0xc);
    *(undefined4 *)(lVar3 + 0x24) = *(undefined4 *)(lVar2 + 0x10);
    *(undefined4 *)(lVar3 + 0x28) = *(undefined4 *)(lVar2 + 0x14);
    *(undefined4 *)(lVar3 + 0x30) = *(undefined4 *)(lVar2 + 0x20);
    puVar4 = (undefined4 *)(lVar3 + 0x3c);
    puVar5 = *(undefined4 **)(lVar2 + 0x28);
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      *puVar4 = *puVar5;
      puVar4[1] = puVar5[1];
      puVar4[2] = puVar5[2];
      puVar4[3] = puVar5[4] - (int)lVar3;
      puVar4 = puVar4 + 6;
      puVar5 = puVar5 + 10;
    }
    (*stream->_vptr_Stream[3])(stream,lVar3 + 0x18,(ulong)*(uint *)(lVar2 + 4));
    (*stream->_vptr_Stream[3])
              (stream,*(undefined8 *)(lVar2 + 0x18),
               (ulong)(uint)(*(int *)(lVar2 + 0x10) * *(int *)(lVar2 + 0x14)));
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return stream;
	stream->writeU32(PLATFORM_XBOX);
	assert(rw::version >= 0x35000 && "can't write native Xbox data < 0x35000");
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;

	// we just fill header->data and write that
	uint8 *p = header->data+0x18;
	*(int32*)p = header->size; p += 4;
	*(uint16*)p = header->serialNumber; p += 2;
	*(uint16*)p = header->numMeshes; p += 2;
	*(uint32*)p = header->primType; p += 4;
	*(uint32*)p = header->numVertices; p += 4;
	*(uint32*)p = header->stride; p += 4;
	// RxXboxVertexFormat in 3.3 here
	p += 4;	// skip vertexBuffer pointer
	*(bool32*)p = header->vertexAlpha; p += 4;
	p += 8; // skip begin, end pointers

	InstanceData *inst = header->begin;
	for(int i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->minVert; p += 4;
		*(int32*)p = inst->numVertices; p += 4;
		*(int32*)p = inst->numIndices; p += 4;
		*(uint32*)p = (uint8*)inst->indexBuffer - header->data; p += 4;
		p += 8; // skip material and vertexShader
		// pixelShader in 3.3 here
		inst++;
	}

	stream->write8(header->data+0x18, header->size);
	stream->write8(header->vertexBuffer, header->stride*header->numVertices);
	return stream;
}